

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddInteract.c
# Opt level: O1

void ddClearLocal(DdNode *f)

{
  DdNode *pDVar1;
  
  while ((f->index != 0x7fffffff && (pDVar1 = (f->type).kids.T, ((ulong)pDVar1 & 1) != 0))) {
    pDVar1 = (DdNode *)((ulong)pDVar1 & 0xfffffffffffffffe);
    (f->type).kids.T = pDVar1;
    ddClearLocal(pDVar1);
    f = (DdNode *)((ulong)(f->type).kids.E & 0xfffffffffffffffe);
  }
  return;
}

Assistant:

static void
ddClearLocal(
  DdNode * f)
{
    if (cuddIsConstant(f) || !Cudd_IsComplement(cuddT(f))) {
        return;
    }
    /* clear visited flag */
    cuddT(f) = Cudd_Regular(cuddT(f));
    ddClearLocal(cuddT(f));
    ddClearLocal(Cudd_Regular(cuddE(f)));
    return;

}